

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_rescale_enc.c
# Opt level: O2

int WebPPictureCrop(WebPPicture *pic,int left,int top,int width,int height)

{
  int iVar1;
  uint32_t *src;
  int width_00;
  int iVar2;
  int top_local;
  int left_local;
  int local_138;
  int local_134;
  WebPPicture tmp;
  
  if (pic == (WebPPicture *)0x0) {
    return 0;
  }
  top_local = top;
  left_local = left;
  iVar1 = AdjustAndCheckRectangle(pic,&left_local,&top_local,width,height);
  if (iVar1 == 0) {
    return 0;
  }
  memcpy(&tmp,pic,0x100);
  WebPPictureResetBuffers(&tmp);
  tmp.width = width;
  tmp.height = height;
  iVar1 = WebPPictureAlloc(&tmp);
  if (iVar1 == 0) {
    return 0;
  }
  if (pic->use_argb == 0) {
    local_134 = top_local;
    local_138 = left_local;
    iVar2 = left_local / 2 + (top_local / 2) * pic->uv_stride;
    WebPCopyPlane(pic->y + (pic->y_stride * top_local + left_local),pic->y_stride,tmp.y,tmp.y_stride
                  ,width,height);
    width_00 = width + 1 >> 1;
    iVar1 = height + 1 >> 1;
    WebPCopyPlane(pic->u + iVar2,pic->uv_stride,tmp.u,tmp.uv_stride,width_00,iVar1);
    WebPCopyPlane(pic->v + iVar2,pic->uv_stride,tmp.v,tmp.uv_stride,width_00,iVar1);
    if (tmp.a == (uint8_t *)0x0) goto LAB_001239df;
    iVar1 = pic->a_stride;
    src = (uint32_t *)(pic->a + (local_134 * iVar1 + local_138));
    tmp.argb = (uint32_t *)tmp.a;
  }
  else {
    src = pic->argb + (long)top_local * (long)pic->argb_stride + (long)left_local;
    iVar1 = pic->argb_stride * 4;
    tmp.a_stride = tmp.argb_stride << 2;
    width = width << 2;
  }
  WebPCopyPlane((uint8_t *)src,iVar1,(uint8_t *)tmp.argb,tmp.a_stride,width,height);
LAB_001239df:
  WebPPictureFree(pic);
  memcpy(pic,&tmp,0x100);
  return 1;
}

Assistant:

int WebPPictureCrop(WebPPicture* pic,
                    int left, int top, int width, int height) {
  WebPPicture tmp;

  if (pic == NULL) return 0;
  if (!AdjustAndCheckRectangle(pic, &left, &top, width, height)) return 0;

  PictureGrabSpecs(pic, &tmp);
  tmp.width = width;
  tmp.height = height;
  if (!WebPPictureAlloc(&tmp)) return 0;

  if (!pic->use_argb) {
    const int y_offset = top * pic->y_stride + left;
    const int uv_offset = (top / 2) * pic->uv_stride + left / 2;
    WebPCopyPlane(pic->y + y_offset, pic->y_stride,
                  tmp.y, tmp.y_stride, width, height);
    WebPCopyPlane(pic->u + uv_offset, pic->uv_stride,
                  tmp.u, tmp.uv_stride, HALVE(width), HALVE(height));
    WebPCopyPlane(pic->v + uv_offset, pic->uv_stride,
                  tmp.v, tmp.uv_stride, HALVE(width), HALVE(height));

    if (tmp.a != NULL) {
      const int a_offset = top * pic->a_stride + left;
      WebPCopyPlane(pic->a + a_offset, pic->a_stride,
                    tmp.a, tmp.a_stride, width, height);
    }
  } else {
    const uint8_t* const src =
        (const uint8_t*)(pic->argb + top * pic->argb_stride + left);
    WebPCopyPlane(src, pic->argb_stride * 4, (uint8_t*)tmp.argb,
                  tmp.argb_stride * 4, width * 4, height);
  }
  WebPPictureFree(pic);
  *pic = tmp;
  return 1;
}